

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

int mbedtls_des_self_test(int verbose)

{
  char *pcVar1;
  uchar (*pauVar2) [8];
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uchar buf [8];
  mbedtls_des_context ctx;
  uint32_t sk [96];
  mbedtls_des3_context ctx3;
  uchar local_3e8 [8];
  int local_3e0;
  uint uStack_3dc;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  mbedtls_des_context local_3b8 [4];
  mbedtls_des3_context local_1b0;
  
  local_3b8[0].sk[0] = 0;
  local_3b8[0].sk[1] = 0;
  local_3b8[0].sk[2] = 0;
  local_3b8[0].sk[3] = 0;
  local_3b8[0].sk[4] = 0;
  local_3b8[0].sk[5] = 0;
  local_3b8[0].sk[6] = 0;
  local_3b8[0].sk[7] = 0;
  local_3b8[0].sk[8] = 0;
  local_3b8[0].sk[9] = 0;
  local_3b8[0].sk[10] = 0;
  local_3b8[0].sk[0xb] = 0;
  local_3b8[0].sk[0xc] = 0;
  local_3b8[0].sk[0xd] = 0;
  local_3b8[0].sk[0xe] = 0;
  local_3b8[0].sk[0xf] = 0;
  local_3b8[0].sk[0x10] = 0;
  local_3b8[0].sk[0x11] = 0;
  local_3b8[0].sk[0x12] = 0;
  local_3b8[0].sk[0x13] = 0;
  local_3b8[0].sk[0x14] = 0;
  local_3b8[0].sk[0x15] = 0;
  local_3b8[0].sk[0x16] = 0;
  local_3b8[0].sk[0x17] = 0;
  local_3b8[0].sk[0x18] = 0;
  local_3b8[0].sk[0x19] = 0;
  local_3b8[0].sk[0x1a] = 0;
  local_3b8[0].sk[0x1b] = 0;
  local_3b8[0].sk[0x1c] = 0;
  local_3b8[0].sk[0x1d] = 0;
  local_3b8[0].sk[0x1e] = 0;
  local_3b8[0].sk[0x1f] = 0;
  memset(&local_1b0,0,0x180);
  uVar4 = 0;
  local_3e0 = verbose;
  do {
    while( true ) {
      if (verbose != 0) {
        uVar5 = 0x33;
        if (uVar4 < 2) {
          uVar5 = 0x20;
        }
        pcVar1 = "enc";
        if ((uVar4 & 1) == 0) {
          pcVar1 = "dec";
        }
        printf("  DES%c-ECB-%3d (%s): ",uVar5,(ulong)((uVar4 >> 1) * 0x38 + 0x38),pcVar1);
      }
      builtin_memcpy(local_3e8,"Now is t",8);
      mbedtls_des_setkey_dec(local_3b8,des3_test_keys);
      iVar3 = 100;
      do {
        if (uVar4 < 2) {
          mbedtls_des_crypt_ecb(local_3b8,local_3e8,local_3e8);
        }
        else {
          mbedtls_des3_crypt_ecb(&local_1b0,local_3e8,local_3e8);
        }
        verbose = local_3e0;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      if ((uVar4 & 1) == 0) {
        pauVar2 = des3_test_ecb_dec;
      }
      else {
        pauVar2 = des3_test_ecb_enc;
      }
      if (local_3e8 != pauVar2[uVar4 >> 1]) {
        iVar3 = 1;
        if (local_3e0 == 0) goto LAB_0013901b;
        goto LAB_00139001;
      }
      if (local_3e0 == 0) break;
      puts("passed");
      uVar4 = uVar4 + 1;
      if (uVar4 == 6) {
        putchar(10);
        goto LAB_00138dd0;
      }
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 6);
LAB_00138dd0:
  uVar4 = 0;
LAB_00138de9:
  do {
    if (verbose != 0) {
      uVar5 = 0x33;
      if (uVar4 < 2) {
        uVar5 = 0x20;
      }
      pcVar1 = "enc";
      if ((uVar4 & 1) == 0) {
        pcVar1 = "dec";
      }
      printf("  DES%c-CBC-%3d (%s): ",uVar5,(ulong)((uVar4 >> 1) * 0x38 + 0x38),pcVar1);
    }
    builtin_memcpy(local_3e8,"Now is t",8);
    uStack_3dc = uVar4 >> 1;
    mbedtls_des_setkey_dec(local_3b8,des3_test_keys);
    iVar3 = 100;
    uVar6 = 0x78563412;
    uVar7 = 0xefcdab90;
    uVar8 = 0;
    uVar9 = 0;
    do {
      uStack_3d8._0_1_ = local_3e8[0];
      uStack_3d8._1_1_ = local_3e8[1];
      uStack_3d8._2_1_ = local_3e8[2];
      uStack_3d8._3_1_ = local_3e8[3];
      uStack_3d8._4_1_ = local_3e8[4];
      uStack_3d8._5_1_ = local_3e8[5];
      uStack_3d8._6_1_ = local_3e8[6];
      uStack_3d8._7_1_ = local_3e8[7];
      uStack_3d0 = 0;
      uStack_3c8 = uVar6;
      uStack_3c4 = uVar7;
      uStack_3c0 = uVar8;
      uStack_3bc = uVar9;
      if (uVar4 < 2) {
        mbedtls_des_crypt_ecb(local_3b8,local_3e8,local_3e8);
      }
      else {
        mbedtls_des3_crypt_ecb(&local_1b0,local_3e8,local_3e8);
      }
      verbose = local_3e0;
      uVar6 = local_3e8._0_4_ ^ uStack_3c8;
      uVar7 = local_3e8._4_4_ ^ uStack_3c4;
      local_3e8[4] = (char)uVar7;
      local_3e8[5] = (char)(uVar7 >> 8);
      local_3e8[6] = (char)(uVar7 >> 0x10);
      local_3e8[7] = (char)(uVar7 >> 0x18);
      local_3e8[0] = (char)uVar6;
      local_3e8[1] = (char)(uVar6 >> 8);
      local_3e8[2] = (char)(uVar6 >> 0x10);
      local_3e8[3] = (char)(uVar6 >> 0x18);
      iVar3 = iVar3 + -1;
      uVar6 = (uint)uStack_3d8;
      uVar7 = uStack_3d8._4_4_;
      uVar8 = (undefined4)uStack_3d0;
      uVar9 = uStack_3d0._4_4_;
    } while (iVar3 != 0);
    if (local_3e8 != des3_test_cbc_dec[uStack_3dc]) {
      iVar3 = 1;
      if (local_3e0 != 0) {
LAB_00139001:
        iVar3 = 1;
        puts("failed");
      }
      goto LAB_0013901b;
    }
    if (local_3e0 != 0) {
      puts("passed");
      uVar4 = uVar4 + 1;
      if (uVar4 == 6) {
        putchar(10);
        goto LAB_00139019;
      }
      goto LAB_00138de9;
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == 6) {
LAB_00139019:
      iVar3 = 0;
LAB_0013901b:
      mbedtls_platform_zeroize(local_3b8,0x80);
      mbedtls_platform_zeroize(&local_1b0,0x180);
      return iVar3;
    }
  } while( true );
}

Assistant:

int mbedtls_des_self_test( int verbose )
{
    int i, j, u, v, ret = 0;
    mbedtls_des_context ctx;
    mbedtls_des3_context ctx3;
    unsigned char buf[8];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[8];
    unsigned char iv[8];
#endif

    mbedtls_des_init( &ctx );
    mbedtls_des3_init( &ctx3 );
    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-ECB-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        for( j = 0; j < 100; j++ )
        {
            if( u == 0 )
                mbedtls_des_crypt_ecb( &ctx, buf, buf );
            else
                mbedtls_des3_crypt_ecb( &ctx3, buf, buf );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-CBC-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  des3_test_iv,  8 );
        memcpy( prv, des3_test_iv,  8 );
        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        if( v == MBEDTLS_DES_DECRYPT )
        {
            for( j = 0; j < 100; j++ )
            {
                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );
            }
        }
        else
        {
            for( j = 0; j < 100; j++ )
            {
                unsigned char tmp[8];

                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );

                memcpy( tmp, prv, 8 );
                memcpy( prv, buf, 8 );
                memcpy( buf, tmp, 8 );
            }

            memcpy( buf, prv, 8 );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_des_free( &ctx );
    mbedtls_des3_free( &ctx3 );

    return( ret );
}